

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kakuro.cc
# Opt level: O2

void solve(grid *b,uint idx)

{
  run *prVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  _Base_bitset<1UL> _Var5;
  pointer prVar6;
  _Base_bitset<1UL> _Var7;
  logic_error *this;
  uint uVar8;
  uint i;
  ulong uVar9;
  long lVar10;
  
  uVar3 = b->rows_;
  uVar8 = b->cols_;
  uVar9 = (ulong)idx;
  lVar10 = uVar9 << 4;
  while( true ) {
    if (uVar8 * uVar3 <= uVar9) {
      for (uVar9 = 0; uVar9 < uVar3 * uVar8; uVar9 = uVar9 + 1) {
        if ((int)((uVar9 & 0xffffffff) % (ulong)uVar8) == 0) {
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        if ((b->cells_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar9] == 0xffffffff) {
          std::operator<<((ostream *)&std::cout,'.');
        }
        else {
          std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        }
        uVar3 = b->rows_;
        uVar8 = b->cols_;
      }
      poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      std::endl<char,std::char_traits<char>>(poVar4);
      return;
    }
    if ((b->cells_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9] != 0xffffffff) break;
    uVar9 = uVar9 + 1;
    lVar10 = lVar10 + 0x10;
  }
  prVar6 = (b->runs_).super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>._M_impl.
           super__Vector_impl_data._M_start;
  prVar1 = *(run **)((long)prVar6->r_ + lVar10);
  if (prVar1 == (run *)0x0) {
    _Var5._M_w = 0;
  }
  else {
    _Var5._M_w = (_WordT)feasible_addend_set(prVar1);
    prVar6 = (b->runs_).super__Vector_base<grid::run_pair,_std::allocator<grid::run_pair>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  prVar1 = *(run **)((long)prVar6->r_ + lVar10 + 8);
  if (prVar1 == (run *)0x0) {
    _Var7._M_w = 0;
  }
  else {
    _Var7._M_w = (_WordT)feasible_addend_set(prVar1);
  }
  uVar3 = (uint)uVar9;
  uVar9 = 1;
  do {
    if (uVar9 == 10) {
      grid::put(b,uVar3,0);
      return;
    }
    if (((_Var7._M_w & _Var5._M_w) >> (uVar9 & 0x3f) & 1) != 0) {
      bVar2 = grid::put(b,uVar3,(uint)uVar9);
      if (!bVar2) {
        this = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(this,"duplicate trial number");
        __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      solve(b,uVar3 + 1);
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static void solve(grid &b, unsigned idx)
{
	/* if we come this far, the grid contains a solution */
	if(idx >= b.rows_ * b.cols_) {
		print(b);
		return;
	}

	/*
	  for coding simplicity, we always recurse, even on nonfillable cells.
	  so skip them here..
	*/
	if(b.cells_[idx] == -1U) {
		solve(b, idx+1);
		return;
	}

	bitset<10> trial_numbers = feasible_numbers(b, idx);
	for(unsigned i = 1; i < 10; i++)
		if(trial_numbers[i]) {
			/*
			  putting should always succeed since the trial number set is
			  calculated so that it contains only not present numbers.
			*/
			if(!b.put(idx, i))
				throw logic_error("duplicate trial number");
			solve(b, idx+1);
		}

	/* UNDO number placement before backtracking */
	b.put(idx, 0);
}